

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O1

void __thiscall pg::SSPMSolver::prog_tmp(SSPMSolver *this,int pindex,int h)

{
  int iVar1;
  uint64_t *puVar2;
  byte bVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  
  piVar4 = this->tmp_d;
  iVar1 = *piVar4;
  if (iVar1 != -1) {
    iVar6 = this->l;
    uVar10 = (ulong)iVar6;
    if (pindex < piVar4[uVar10 - 1]) {
      if (0 < iVar6) {
        puVar2 = (this->tmp_b)._bits;
        do {
          iVar1 = (int)uVar10;
          uVar5 = iVar1 - 1;
          if (piVar4[uVar5] <= pindex) goto LAB_00166f1b;
          bVar3 = (byte)uVar5 & 0x3f;
          puVar11 = puVar2 + (uVar5 >> 6);
          *puVar11 = *puVar11 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
          piVar4[uVar5] = pindex;
          uVar10 = (ulong)(iVar1 - 1U);
        } while (iVar1 - 1U != 0 && 0 < iVar1);
        uVar5 = 0xffffffff;
LAB_00166f1b:
        iVar6 = uVar5 + 1;
      }
      puVar11 = (this->tmp_b)._bits + ((ulong)(long)iVar6 >> 6);
      *puVar11 = *puVar11 | 1L << ((long)iVar6 & 0x3fU);
    }
    else if (0 < iVar6) {
      uVar10 = uVar10 - 1;
      puVar2 = (this->tmp_b)._bits;
      uVar12 = uVar10 & 0xffffffff;
      puVar11 = puVar2 + (uVar10 >> 6 & 0x3ffffff);
      uVar13 = 1L << (uVar10 & 0x3f);
      uVar8 = *puVar11;
      if ((uVar8 >> (uVar10 & 0x3f) & 1) == 0) {
        uVar9 = uVar10 & 0xffffffff;
      }
      else {
        uVar9 = uVar10 & 0xffffffff;
        do {
          iVar6 = (int)uVar9;
          uVar5 = iVar6 - 1;
          uVar9 = (ulong)uVar5;
          if (iVar6 == 0) {
            if (iVar1 == 0) {
              *(byte *)puVar2 = (byte)*puVar2 & 0xfe;
              *piVar4 = -1;
              return;
            }
            *(byte *)puVar2 = (byte)*puVar2 | 1;
            if (this->l < 1) {
              return;
            }
            lVar7 = 0;
            do {
              piVar4[lVar7] = iVar1 + -1;
              lVar7 = lVar7 + 1;
            } while (lVar7 < this->l);
            return;
          }
          iVar6 = piVar4[uVar12];
          if (piVar4[uVar12 - 1] != iVar6) {
            *puVar11 = uVar8 | uVar13;
            if (this->l <= (int)uVar10) {
              return;
            }
            piVar4 = piVar4 + (uVar10 & 0xffffffff);
            do {
              *piVar4 = iVar6 + -1;
              piVar4 = piVar4 + 1;
              uVar5 = (int)uVar10 + 1;
              uVar10 = (ulong)uVar5;
            } while ((int)uVar5 < this->l);
            return;
          }
          *puVar11 = ~uVar13 & uVar8;
          uVar12 = (ulong)uVar5;
          puVar11 = puVar2 + (uVar5 >> 6);
          uVar13 = 1L << (uVar9 & 0x3f);
          uVar8 = *puVar11;
          uVar10 = (ulong)uVar5;
        } while ((uVar8 >> (uVar9 & 0x3f) & 1) != 0);
      }
      iVar1 = piVar4[uVar12];
      if (iVar1 == h) {
        *puVar11 = uVar8 | uVar13;
      }
      else {
        *puVar11 = ~uVar13 & uVar8;
        if ((int)uVar9 < this->l) {
          piVar4 = piVar4 + uVar9;
          do {
            *piVar4 = iVar1 + 1;
            piVar4 = piVar4 + 1;
            uVar5 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar5;
          } while ((int)uVar5 < this->l);
        }
      }
    }
  }
  return;
}

Assistant:

void
SSPMSolver::prog_tmp(int pindex, int h)
{
    // Simple case 1: Top >_p Top
    if (tmp_d[0] == -1) return; // already Top

    // Simple case 2: Some bits below [pindex], ergo [pindex] can go from ..e to ..10*
    if (tmp_d[l-1] > pindex) {
        int i;
        for (i=l-1; i>=0 and tmp_d[i] > pindex; i--) {
            tmp_b[i] = 0;
            tmp_d[i] = pindex;
        }
        tmp_b[i+1] = 1;
        return;
    }

    // Case 3: no bits below [pindex], so analyze lowest nonempty level
    // * If lowest contains 0: 3a or 3b
    // * Else if lowest level is root: 3c
    // * Else append 100000000... to next higher level (3d, 3e, 3f)
    //
    // 3a: ,..011*  => ,..100*  (if lowest nonempty is the bottom)
    // 3b: ,..011*, => ,..,000* (if lowest nonempty is not the bottom)
    // 3c: 1111111  => Top      (if root contains only 1s)
    // 3d: ,1111111 => 100*     (if non-root contains only 1s)
    // 3e: ..,111*  => ..100*
    // 3f: ,e,111*  => ,100*

    // no bits below pindex, so just find smallest increase
    for (int i=l-1; i>=0; i--) {
        if (tmp_b[i] == 0) {
            if (tmp_d[i] == h) {
                // 3a: we found a 0 on the bottom, increase to 100...
                // ..011 => 00100
                tmp_b[i] = 1;
                break;
            } else {
                // 3b: we found a 0 (not bottom), increase to [eps] and 0s on leaf
                // ..011 => ..,000
                tmp_b[i] = 0;
                int new_d = tmp_d[i]+1;
                for (int k=i; k<l; k++) tmp_d[k] = new_d;
                break;
            }
        } else if (i == 0) {
            // we have only seen 1s and only 1 element
            if (tmp_d[0] == 0) {
                // 3c: we are already the highest, so go to top
                tmp_b[0] = 0;
                tmp_d[0] = -1;
                break;
            } else {
                // 3d: increase 1 higher...
                // ,e,111   => ,100
                int new_d = tmp_d[0]-1;
                tmp_b[0] = 1;
                for (int k=0; k<l; k++) tmp_d[k] = new_d;
                break;
            }
        } else if (tmp_d[i-1] != tmp_d[i]) {
            // 3e, 3f: next is different
            // two cases
            //  .,111   => .100
            // ,e,111   => ,100
            int new_d = tmp_d[i]-1;
            tmp_b[i] = 1;
            for (int k=i; k<l; k++) tmp_d[k] = new_d;
            break;
        } else {
            // next is same
            tmp_b[i] = 0;
        }
    }
}